

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O0

void __thiscall BitStreamReader::skipBit(BitStreamReader *this)

{
  uint uVar1;
  BitStreamException *this_00;
  BitStreamReader *this_local;
  
  if ((this->super_BitStream).m_totalBits == 0) {
    this_00 = (BitStreamException *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    BitStreamException::BitStreamException(this_00);
    __cxa_throw(this_00,&BitStreamException::typeinfo,BitStreamException::~BitStreamException);
  }
  if (this->m_bitLeft == 0) {
    (this->super_BitStream).m_buffer = (this->super_BitStream).m_buffer + 1;
    uVar1 = getCurVal(this,(this->super_BitStream).m_buffer);
    this->m_curVal = uVar1;
    this->m_bitLeft = 0x1f;
  }
  else {
    this->m_bitLeft = this->m_bitLeft - 1;
  }
  (this->super_BitStream).m_totalBits = (this->super_BitStream).m_totalBits - 1;
  return;
}

Assistant:

void skipBit()
    {
        if (m_totalBits < 1)
            THROW_BITSTREAM_ERR;
        if (m_bitLeft > 0)
            m_bitLeft--;
        else
        {
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft = INT_BIT - 1;
        }
        m_totalBits--;
    }